

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::InputLayout::Run(InputLayout *this)

{
  uint uVar1;
  long lVar2;
  GLuint program;
  mapped_type *pmVar3;
  key_type local_1b0;
  long error;
  GLenum props [7];
  allocator<char> local_159;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indices;
  GLint expected2 [7];
  GLint expected [7];
  GLint expected8 [7];
  GLint expected7 [7];
  GLint expected6 [7];
  GLint expected5 [7];
  GLint expected4 [7];
  GLint expected3 [7];
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x15])(&indices,this);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(&local_1b0,this);
  program = PIQBase::CreateProgram
                      ((PIQBase *)this,(char *)indices._M_t._M_impl._0_8_,local_1b0._M_dataplus._M_p
                       ,false);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&indices);
  PIQBase::LinkProgram((PIQBase *)this,program);
  error = 0;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e3,0x92f5,8,&error);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e3,0x92f6,2,&error);
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indices._M_t._M_impl.super__Rb_tree_header._M_header;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"a",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e3,&indices,&local_1b0,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"b",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e3,&indices,&local_1b0,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"c",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e3,&indices,&local_1b0,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"d",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e3,&indices,&local_1b0,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"e",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e3,&indices,&local_1b0,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"f",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e3,&indices,&local_1b0,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"g",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e3,&indices,&local_1b0,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"h",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e3,&indices,&local_1b0,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"a",(allocator<char> *)expected);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"a",(allocator<char> *)expected2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e3,(ulong)uVar1,props,&error);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"b",(allocator<char> *)expected);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"b",(allocator<char> *)expected2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e3,(ulong)uVar1,props,&error);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"c",(allocator<char> *)expected);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"c",(allocator<char> *)expected2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e3,(ulong)uVar1,props,&error);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"d",(allocator<char> *)expected);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"d",(allocator<char> *)expected2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e3,(ulong)uVar1,props,&error);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"e",(allocator<char> *)expected);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"e",(allocator<char> *)expected2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e3,(ulong)uVar1,props,&error);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"f",(allocator<char> *)expected);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"f",(allocator<char> *)expected2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e3,(ulong)uVar1,props,&error);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"g",(allocator<char> *)expected);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"g",(allocator<char> *)expected2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e3,(ulong)uVar1,props,&error);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"h",(allocator<char> *)expected);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"h",(allocator<char> *)expected2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e3,(ulong)uVar1,props,&error);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"a",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,&local_1b0,0,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"b",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,&local_1b0,4,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"c",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,&local_1b0,5,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"d",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,&local_1b0,7,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"e",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,&local_1b0,0xb,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"f",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,&local_1b0,0xc,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"g",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,&local_1b0,0xd,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"h",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,&local_1b0,0xf,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  props[4] = 0x930a;
  props[5] = 0x9306;
  props[6] = 0x930e;
  props[0] = 0x92f9;
  props[1] = 0x92fa;
  props[2] = 0x92fb;
  props[3] = 0x930b;
  expected[4] = 0;
  expected[5] = 1;
  expected[6] = 0;
  expected[0] = 2;
  expected[1] = 0x8b5c;
  expected[2] = 1;
  expected[3] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"a",(allocator<char> *)expected2);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e3,(ulong)*pmVar3,7,props,7,(allocator<char> *)expected,&error);
  std::__cxx11::string::~string((string *)&local_1b0);
  expected2[4] = 0;
  expected2[5] = 1;
  expected2[6] = 4;
  expected2[0] = 2;
  expected2[1] = 0x8b52;
  expected2[2] = 1;
  expected2[3] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"b",(allocator<char> *)expected3);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e3,(ulong)*pmVar3,7,props,7,(allocator<char> *)expected2,&error)
  ;
  std::__cxx11::string::~string((string *)&local_1b0);
  expected3[4] = 0;
  expected3[5] = 1;
  expected3[6] = 5;
  expected3[0] = 2;
  expected3[1] = 0x1406;
  expected3[2] = 1;
  expected3[3] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"c",(allocator<char> *)expected4);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e3,(ulong)*pmVar3,7,props,7,(allocator<char> *)expected3,&error)
  ;
  std::__cxx11::string::~string((string *)&local_1b0);
  expected4[4] = 0;
  expected4[5] = 1;
  expected4[6] = 7;
  expected4[0] = 2;
  expected4[1] = 0x8b65;
  expected4[2] = 1;
  expected4[3] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"d",(allocator<char> *)expected5);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e3,(ulong)*pmVar3,7,props,7,(allocator<char> *)expected4,&error)
  ;
  std::__cxx11::string::~string((string *)&local_1b0);
  expected5[4] = 0;
  expected5[5] = 1;
  expected5[6] = 0xb;
  expected5[0] = 2;
  expected5[1] = 0x8b50;
  expected5[2] = 1;
  expected5[3] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"e",(allocator<char> *)expected6);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e3,(ulong)*pmVar3,7,props,7,(allocator<char> *)expected5,&error)
  ;
  std::__cxx11::string::~string((string *)&local_1b0);
  expected6[4] = 0;
  expected6[5] = 1;
  expected6[6] = 0xc;
  expected6[0] = 2;
  expected6[1] = 0x1405;
  expected6[2] = 1;
  expected6[3] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"f",(allocator<char> *)expected7);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e3,(ulong)*pmVar3,7,props,7,(allocator<char> *)expected6,&error)
  ;
  std::__cxx11::string::~string((string *)&local_1b0);
  expected7[4] = 0;
  expected7[5] = 1;
  expected7[6] = 0xd;
  expected7[0] = 2;
  expected7[1] = 0x8b51;
  expected7[2] = 1;
  expected7[3] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"g",(allocator<char> *)expected8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e3,(ulong)*pmVar3,7,props,7,(allocator<char> *)expected7,&error)
  ;
  std::__cxx11::string::~string((string *)&local_1b0);
  expected8[4] = 0;
  expected8[5] = 1;
  expected8[6] = 0xf;
  expected8[0] = 2;
  expected8[1] = 0x1404;
  expected8[2] = 1;
  expected8[3] = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"h",&local_159);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_1b0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e3,(ulong)*pmVar3,7,props,7,(allocator<char> *)expected8,&error)
  ;
  std::__cxx11::string::~string((string *)&local_1b0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,program);
  lVar2 = error;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indices._M_t);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, 8, error);
		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_MAX_NAME_LENGTH, 2, error);

		std::map<std::string, GLuint> indices;
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "a", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "b", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "c", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "d", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "e", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "f", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "g", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "h", error);

		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["a"], "a", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["b"], "b", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["c"], "c", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["d"], "d", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["e"], "e", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["f"], "f", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["g"], "g", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["h"], "h", error);

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "a", 0, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "b", 4, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "c", 5, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "d", 7, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "e", 11, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "f", 12, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "g", 13, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "h", 15, error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION };
		GLint expected[] = { 2, 35676, 1, 0, 0, 1, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["a"], 7, props, 7, expected, error);
		GLint expected2[] = { 2, 35666, 1, 0, 0, 1, 4 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["b"], 7, props, 7, expected2, error);
		GLint expected3[] = { 2, 5126, 1, 0, 0, 1, 5 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["c"], 7, props, 7, expected3, error);
		GLint expected4[] = { 2, 35685, 1, 0, 0, 1, 7 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["d"], 7, props, 7, expected4, error);
		GLint expected5[] = { 2, 35664, 1, 0, 0, 1, 11 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["e"], 7, props, 7, expected5, error);
		GLint expected6[] = { 2, 5125, 1, 0, 0, 1, 12 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["f"], 7, props, 7, expected6, error);
		GLint expected7[] = { 2, 35665, 1, 0, 0, 1, 13 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["g"], 7, props, 7, expected7, error);
		GLint expected8[] = { 2, 5124, 1, 0, 0, 1, 15 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["h"], 7, props, 7, expected8, error);

		glDeleteProgram(program);
		return error;
	}